

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsSampled.cpp
# Opt level: O0

void __thiscall
vkt::sparse::SparseShaderIntrinsicsCaseSampledBase::initPrograms
          (SparseShaderIntrinsicsCaseSampledBase *this,SourceCollections *programCollection)

{
  ImageType imageType;
  int iVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  SpirVAsmSource *src;
  TextureFormat *format;
  TextureFormat *format_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730 [39];
  allocator<char> local_709;
  string local_708 [39];
  allocator<char> local_6e1;
  string local_6e0 [39];
  allocator<char> local_6b9;
  string local_6b8 [32];
  string local_698 [32];
  string local_678;
  undefined1 local_658 [8];
  string typeImgCompVec4;
  string typeImgComp;
  ostringstream fs;
  string local_4a0;
  ShaderSource local_480;
  allocator<char> local_451;
  string local_450;
  ostringstream local_430 [8];
  ostringstream gs;
  undefined1 local_2b0 [4];
  deInt32 maxVertices;
  ShaderSource local_290;
  allocator<char> local_261;
  string local_260;
  ostringstream local_240 [8];
  ostringstream vs;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string coordString;
  deUint32 numLayers;
  SourceCollections *programCollection_local;
  SparseShaderIntrinsicsCaseSampledBase *this_local;
  
  coordString.field_2._12_4_ =
       getNumLayers((this->super_SparseShaderIntrinsicsCaseBase).m_imageType,
                    &(this->super_SparseShaderIntrinsicsCaseBase).m_imageSize);
  imageType = (this->super_SparseShaderIntrinsicsCaseBase).m_imageType;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"%local_texCoord_x",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"%local_texCoord_xy",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"%local_texCoord_xyz",&local_c1);
  getShaderImageCoordinates((string *)local_40,imageType,&local_60,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::ostringstream::ostringstream(local_240);
  poVar2 = std::operator<<((ostream *)local_240,"#version 440\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp vec2 vs_in_position;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 1) in  highp vec2 vs_in_texCoord;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec3 vs_out_texCoord;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"\tvec4  gl_Position;\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position\t\t= vec4(vs_in_position, 0.0f, 1.0f);\n");
  poVar2 = std::operator<<(poVar2,"\tvs_out_texCoord = vec3(vs_in_texCoord, 0.0f);\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"vertex_shader",&local_261);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_260);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_290,(string *)local_2b0);
  glu::ProgramSources::operator<<(pPVar3,&local_290);
  glu::VertexSource::~VertexSource((VertexSource *)&local_290);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  if (1 < (uint)coordString.field_2._12_4_) {
    iVar1 = coordString.field_2._12_4_ * 3;
    std::__cxx11::ostringstream::ostringstream(local_430);
    poVar2 = std::operator<<((ostream *)local_430,"#version 440\n");
    poVar2 = std::operator<<(poVar2,"layout(triangles) in;\n");
    poVar2 = std::operator<<(poVar2,"layout(triangle_strip, max_vertices = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") out;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"in gl_PerVertex {\n");
    poVar2 = std::operator<<(poVar2,"\tvec4  gl_Position;\n");
    poVar2 = std::operator<<(poVar2,"} gl_in[];\n");
    poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
    poVar2 = std::operator<<(poVar2,"\tvec4  gl_Position;\n");
    poVar2 = std::operator<<(poVar2,"};\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp vec3 gs_in_texCoord[];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec3 gs_out_texCoord;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"    for (int layerNdx = 0; layerNdx < ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,coordString.field_2._12_4_);
    poVar2 = std::operator<<(poVar2,"; ++layerNdx)\n");
    poVar2 = std::operator<<(poVar2,"    {\n");
    poVar2 = std::operator<<(poVar2,
                             "\t\tfor (int vertexNdx = 0; vertexNdx < gl_in.length(); ++vertexNdx)\n"
                            );
    poVar2 = std::operator<<(poVar2,"\t\t{\n");
    poVar2 = std::operator<<(poVar2,"\t\t\tgl_Layer\t\t= layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"\t\t\tgl_Position\t\t= gl_in[vertexNdx].gl_Position;\n");
    poVar2 = std::operator<<(poVar2,
                             "\t\t\tgs_out_texCoord = vec3(gs_in_texCoord[vertexNdx].xy, float(layerNdx));\n"
                            );
    poVar2 = std::operator<<(poVar2,"\t\t\tEmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\t\t}\n");
    poVar2 = std::operator<<(poVar2,"\t\tEndPrimitive();\n");
    poVar2 = std::operator<<(poVar2,"    }\n");
    std::operator<<(poVar2,"}\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"geometry_shader",&local_451);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_450);
    std::__cxx11::ostringstream::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_480,&local_4a0);
    glu::ProgramSources::operator<<(pPVar3,&local_480);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::__cxx11::ostringstream::~ostringstream(local_430);
  }
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)(typeImgComp.field_2._M_local_buf + 8));
  getImageComponentTypeName_abi_cxx11_
            ((string *)((long)&typeImgCompVec4.field_2 + 8),
             (sparse *)&(this->super_SparseShaderIntrinsicsCaseBase).m_format,format);
  getImageComponentVec4TypeName_abi_cxx11_
            ((string *)local_658,(sparse *)&(this->super_SparseShaderIntrinsicsCaseBase).m_format,
             format_00);
  poVar2 = std::operator<<((ostream *)(typeImgComp.field_2._M_local_buf + 8),"OpCapability Shader\n"
                          );
  poVar2 = std::operator<<(poVar2,"OpCapability SampledCubeArray\n");
  poVar2 = std::operator<<(poVar2,"OpCapability ImageCubeArray\n");
  poVar2 = std::operator<<(poVar2,"OpCapability SparseResidency\n");
  poVar2 = std::operator<<(poVar2,"OpCapability StorageImageExtendedFormats\n");
  poVar2 = std::operator<<(poVar2,"%ext_import = OpExtInstImport \"GLSL.std.450\"\n");
  poVar2 = std::operator<<(poVar2,"OpMemoryModel Logical GLSL450\n");
  poVar2 = std::operator<<(poVar2,
                           "OpEntryPoint Fragment %func_main \"main\" %varying_texCoord %output_texel %output_residency\n"
                          );
  poVar2 = std::operator<<(poVar2,"OpExecutionMode %func_main OriginUpperLeft\n");
  poVar2 = std::operator<<(poVar2,"OpSource GLSL 440\n");
  poVar2 = std::operator<<(poVar2,"OpName %func_main \"main\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %varying_texCoord \"varying_texCoord\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %output_texel \"out_texel\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %output_residency \"out_residency\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %type_uniformblock \"LodBlock\"\n");
  poVar2 = std::operator<<(poVar2,"OpMemberName %type_uniformblock 0 \"lod\"\n");
  poVar2 = std::operator<<(poVar2,"OpMemberName %type_uniformblock 1 \"size\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %uniformblock_instance \"lodInstance\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %uniformconst_image_sparse \"u_imageSparse\"\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %varying_texCoord Location 0\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %output_texel\t Location 0\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %output_residency Location 1\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate\t\t %type_uniformblock Block\n");
  poVar2 = std::operator<<(poVar2,"OpMemberDecorate %type_uniformblock 0 Offset 0\n");
  poVar2 = std::operator<<(poVar2,"OpMemberDecorate %type_uniformblock 1 Offset 8\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %uniformconst_image_sparse DescriptorSet 0\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %uniformconst_image_sparse Binding ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%type_void = OpTypeVoid\n");
  poVar2 = std::operator<<(poVar2,"%type_void_func = OpTypeFunction %type_void\n");
  poVar2 = std::operator<<(poVar2,"%type_bool\t\t\t\t\t\t\t= OpTypeBool\n");
  poVar2 = std::operator<<(poVar2,"%type_int\t\t\t\t\t\t\t= OpTypeInt 32 1\n");
  poVar2 = std::operator<<(poVar2,"%type_uint\t\t\t\t\t\t\t= OpTypeInt 32 0\n");
  poVar2 = std::operator<<(poVar2,"%type_float\t\t\t\t\t\t\t= OpTypeFloat 32\n");
  poVar2 = std::operator<<(poVar2,"%type_vec2\t\t\t\t\t\t\t= OpTypeVector %type_float 2\n");
  poVar2 = std::operator<<(poVar2,"%type_vec3\t\t\t\t\t\t\t= OpTypeVector %type_float 3\n");
  poVar2 = std::operator<<(poVar2,"%type_vec4\t\t\t\t\t\t\t= OpTypeVector %type_float 4\n");
  poVar2 = std::operator<<(poVar2,"%type_ivec4\t\t\t\t\t\t= OpTypeVector %type_int  4\n");
  poVar2 = std::operator<<(poVar2,"%type_uvec4\t\t\t\t\t\t= OpTypeVector %type_uint 4\n");
  poVar2 = std::operator<<(poVar2,
                           "%type_uniformblock\t\t\t\t\t= OpTypeStruct %type_uint %type_vec2\n");
  poVar2 = std::operator<<(poVar2,"%type_struct_int_img_comp_vec4\t= OpTypeStruct %type_int ");
  poVar2 = std::operator<<(poVar2,(string *)local_658);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%type_input_vec3\t\t\t\t\t= OpTypePointer Input %type_vec3\n");
  poVar2 = std::operator<<(poVar2,"%type_input_float\t\t\t\t\t= OpTypePointer Input %type_float\n");
  poVar2 = std::operator<<(poVar2,"%type_output_img_comp_vec4\t\t\t= OpTypePointer Output ");
  poVar2 = std::operator<<(poVar2,(string *)local_658);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%type_output_uint\t\t\t\t\t= OpTypePointer Output %type_uint\n");
  poVar2 = std::operator<<(poVar2,"%type_function_int\t\t\t\t\t= OpTypePointer Function %type_int\n"
                          );
  poVar2 = std::operator<<(poVar2,"%type_function_img_comp_vec4\t\t= OpTypePointer Function ");
  poVar2 = std::operator<<(poVar2,(string *)local_658);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "%type_function_int_img_comp_vec4\t= OpTypePointer Function %type_struct_int_img_comp_vec4\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%type_pushconstant_uniformblock\t\t\t\t= OpTypePointer PushConstant %type_uniformblock\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%type_pushconstant_uniformblock_member_lod  = OpTypePointer PushConstant %type_uint\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%type_pushconstant_uniformblock_member_size = OpTypePointer PushConstant %type_vec2\n"
                          );
  poVar2 = std::operator<<(poVar2,"%type_image_sparse\t\t\t\t= ");
  getOpTypeImageSparse
            (&local_678,(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,
             &(this->super_SparseShaderIntrinsicsCaseBase).m_format,
             (string *)((long)&typeImgCompVec4.field_2 + 8),true);
  poVar2 = std::operator<<(poVar2,(string *)&local_678);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "%type_sampled_image_sparse\t\t= OpTypeSampledImage %type_image_sparse\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_sampled_image_sparse\n"
                          );
  poVar2 = std::operator<<(poVar2,"%varying_texCoord\t\t\t= OpVariable %type_input_vec3 Input\n");
  poVar2 = std::operator<<(poVar2,
                           "%output_texel\t\t\t\t= OpVariable %type_output_img_comp_vec4 Output\n");
  poVar2 = std::operator<<(poVar2,"%output_residency\t\t\t= OpVariable %type_output_uint Output\n");
  poVar2 = std::operator<<(poVar2,
                           "%uniformconst_image_sparse\t= OpVariable %type_uniformconst_image_sparse UniformConstant\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%uniformblock_instance  = OpVariable %type_pushconstant_uniformblock PushConstant\n"
                          );
  poVar2 = std::operator<<(poVar2,"%constant_uint_0\t\t\t\t= OpConstant %type_uint 0\n");
  poVar2 = std::operator<<(poVar2,"%constant_uint_1\t\t\t\t= OpConstant %type_uint 1\n");
  poVar2 = std::operator<<(poVar2,"%constant_uint_2\t\t\t\t= OpConstant %type_uint 2\n");
  poVar2 = std::operator<<(poVar2,"%constant_uint_3\t\t\t\t= OpConstant %type_uint 3\n");
  poVar2 = std::operator<<(poVar2,"%constant_int_0\t\t\t\t\t= OpConstant %type_int  0\n");
  poVar2 = std::operator<<(poVar2,"%constant_int_1\t\t\t\t\t= OpConstant %type_int  1\n");
  poVar2 = std::operator<<(poVar2,"%constant_int_2\t\t\t\t\t= OpConstant %type_int  2\n");
  poVar2 = std::operator<<(poVar2,"%constant_int_3\t\t\t\t\t= OpConstant %type_int  3\n");
  poVar2 = std::operator<<(poVar2,"%constant_float_0\t\t\t\t= OpConstant %type_float 0.0\n");
  poVar2 = std::operator<<(poVar2,"%constant_float_half\t\t\t= OpConstant %type_float 0.5\n");
  poVar2 = std::operator<<(poVar2,"%constant_texel_resident\t\t= OpConstant %type_uint ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%constant_texel_not_resident\t= OpConstant %type_uint ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%func_main\t\t = OpFunction %type_void None %type_void_func\n");
  poVar2 = std::operator<<(poVar2,"%label_func_main = OpLabel\n");
  poVar2 = std::operator<<(poVar2,
                           "%local_image_sparse = OpLoad %type_sampled_image_sparse %uniformconst_image_sparse\n"
                          );
  poVar2 = std::operator<<(poVar2,"%texCoord = OpLoad %type_vec3 %varying_texCoord\n");
  poVar2 = std::operator<<(poVar2,"%local_texCoord_x = OpCompositeExtract %type_float %texCoord 0\n"
                          );
  poVar2 = std::operator<<(poVar2,"%local_texCoord_y = OpCompositeExtract %type_float %texCoord 1\n"
                          );
  poVar2 = std::operator<<(poVar2,"%local_texCoord_z = OpCompositeExtract %type_float %texCoord 2\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_texCoord_xy\t= OpCompositeConstruct %type_vec2 %local_texCoord_x %local_texCoord_y\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_texCoord_xyz = OpCompositeConstruct %type_vec3 %local_texCoord_x %local_texCoord_y %local_texCoord_z\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%access_uniformblock_member_uint_lod = OpAccessChain %type_pushconstant_uniformblock_member_lod %uniformblock_instance %constant_int_0\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_uniformblock_member_uint_lod  = OpLoad %type_uint %access_uniformblock_member_uint_lod\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_uniformblock_member_float_lod = OpConvertUToF %type_float %local_uniformblock_member_uint_lod\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%access_uniformblock_member_size\t = OpAccessChain %type_pushconstant_uniformblock_member_size %uniformblock_instance %constant_int_1\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_uniformblock_member_size\t\t = OpLoad %type_vec2 %access_uniformblock_member_size\n"
                          );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6b8,"%local_sparse_op_result",&local_6b9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,"%type_struct_int_img_comp_vec4",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_708,"%local_image_sparse",&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_730,"%local_uniformblock_member_float_lod",&local_731);
  (*(this->super_SparseShaderIntrinsicsCaseBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])(local_698,this,local_6b8,local_6e0,local_708,local_40,local_730);
  poVar2 = std::operator<<(poVar2,local_698);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%local_img_comp_vec4 = OpCompositeExtract ");
  poVar2 = std::operator<<(poVar2,(string *)local_658);
  poVar2 = std::operator<<(poVar2," %local_sparse_op_result 1\n");
  poVar2 = std::operator<<(poVar2,"OpStore %output_texel %local_img_comp_vec4\n");
  poVar2 = std::operator<<(poVar2,
                           "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
                          );
  poVar2 = std::operator<<(poVar2,"OpSelectionMerge %branch_texel_resident None\n");
  poVar2 = std::operator<<(poVar2,
                           "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
                          );
  poVar2 = std::operator<<(poVar2,"%label_texel_resident = OpLabel\n");
  poVar2 = std::operator<<(poVar2,"OpStore %output_residency %constant_texel_resident\n");
  poVar2 = std::operator<<(poVar2,"OpBranch %branch_texel_resident\n");
  poVar2 = std::operator<<(poVar2,"%label_texel_not_resident = OpLabel\n");
  poVar2 = std::operator<<(poVar2,"OpStore %output_residency %constant_texel_not_resident\n");
  poVar2 = std::operator<<(poVar2,"OpBranch %branch_texel_resident\n");
  poVar2 = std::operator<<(poVar2,"%branch_texel_resident = OpLabel\n");
  poVar2 = std::operator<<(poVar2,"OpReturn\n");
  std::operator<<(poVar2,"OpFunctionEnd\n");
  std::__cxx11::string::~string(local_698);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"fragment_shader",&local_759);
  src = ::vk::ProgramCollection<vk::SpirVAsmSource>::add
                  (&programCollection->spirvAsmSources,&local_758);
  std::__cxx11::ostringstream::str();
  ::vk::operator<<(src,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  std::__cxx11::string::~string((string *)local_658);
  std::__cxx11::string::~string((string *)(typeImgCompVec4.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(typeImgComp.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_240);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void SparseShaderIntrinsicsCaseSampledBase::initPrograms (vk::SourceCollections& programCollection) const
{
	const deUint32		numLayers	= getNumLayers(m_imageType, m_imageSize);
	const std::string	coordString = getShaderImageCoordinates(m_imageType, "%local_texCoord_x", "%local_texCoord_xy", "%local_texCoord_xyz");

	// Create vertex shader
	std::ostringstream vs;

	vs	<< "#version 440\n"
		<< "layout(location = 0) in  highp vec2 vs_in_position;\n"
		<< "layout(location = 1) in  highp vec2 vs_in_texCoord;\n"
		<< "\n"
		<< "layout(location = 0) out highp vec3 vs_out_texCoord;\n"
		<< "\n"
		<< "out gl_PerVertex {\n"
		<< "	vec4  gl_Position;\n"
		<< "};\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position		= vec4(vs_in_position, 0.0f, 1.0f);\n"
		<< "	vs_out_texCoord = vec3(vs_in_texCoord, 0.0f);\n"
		<< "}\n";

	programCollection.glslSources.add("vertex_shader") << glu::VertexSource(vs.str());

	if (numLayers > 1u)
	{
		const deInt32 maxVertices = 3u * numLayers;

		// Create geometry shader
		std::ostringstream gs;

		gs << "#version 440\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = " << static_cast<deInt32>(maxVertices) << ") out;\n"
			<< "\n"
			<< "in gl_PerVertex {\n"
			<< "	vec4  gl_Position;\n"
			<< "} gl_in[];\n"
			<< "out gl_PerVertex {\n"
			<< "	vec4  gl_Position;\n"
			<< "};\n"
			<< "layout(location = 0) in  highp vec3 gs_in_texCoord[];\n"
			<< "\n"
			<< "layout(location = 0) out highp vec3 gs_out_texCoord;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    for (int layerNdx = 0; layerNdx < " << static_cast<deInt32>(numLayers) << "; ++layerNdx)\n"
			<< "    {\n"
			<< "		for (int vertexNdx = 0; vertexNdx < gl_in.length(); ++vertexNdx)\n"
			<< "		{\n"
			<< "			gl_Layer		= layerNdx;\n"
			<< "			gl_Position		= gl_in[vertexNdx].gl_Position;\n"
			<< "			gs_out_texCoord = vec3(gs_in_texCoord[vertexNdx].xy, float(layerNdx));\n"
			<< "			EmitVertex();\n"
			<< "		}\n"
			<< "		EndPrimitive();\n"
			<< "    }\n"
			<< "}\n";

		programCollection.glslSources.add("geometry_shader") << glu::GeometrySource(gs.str());
	}

	// Create fragment shader
	std::ostringstream fs;

	const std::string	typeImgComp		= getImageComponentTypeName(m_format);
	const std::string	typeImgCompVec4	= getImageComponentVec4TypeName(m_format);

	fs	<< "OpCapability Shader\n"
		<< "OpCapability SampledCubeArray\n"
		<< "OpCapability ImageCubeArray\n"
		<< "OpCapability SparseResidency\n"
		<< "OpCapability StorageImageExtendedFormats\n"

		<< "%ext_import = OpExtInstImport \"GLSL.std.450\"\n"
		<< "OpMemoryModel Logical GLSL450\n"
		<< "OpEntryPoint Fragment %func_main \"main\" %varying_texCoord %output_texel %output_residency\n"
		<< "OpExecutionMode %func_main OriginUpperLeft\n"
		<< "OpSource GLSL 440\n"

		<< "OpName %func_main \"main\"\n"

		<< "OpName %varying_texCoord \"varying_texCoord\"\n"

		<< "OpName %output_texel \"out_texel\"\n"
		<< "OpName %output_residency \"out_residency\"\n"

		<< "OpName %type_uniformblock \"LodBlock\"\n"
		<< "OpMemberName %type_uniformblock 0 \"lod\"\n"
		<< "OpMemberName %type_uniformblock 1 \"size\"\n"
		<< "OpName %uniformblock_instance \"lodInstance\"\n"

		<< "OpName %uniformconst_image_sparse \"u_imageSparse\"\n"

		<< "OpDecorate %varying_texCoord Location 0\n"

		<< "OpDecorate %output_texel	 Location 0\n"
		<< "OpDecorate %output_residency Location 1\n"

		<< "OpDecorate		 %type_uniformblock Block\n"
		<< "OpMemberDecorate %type_uniformblock 0 Offset 0\n"
		<< "OpMemberDecorate %type_uniformblock 1 Offset 8\n"

		<< "OpDecorate %uniformconst_image_sparse DescriptorSet 0\n"
		<< "OpDecorate %uniformconst_image_sparse Binding " << BINDING_IMAGE_SPARSE << "\n"

		<< "%type_void = OpTypeVoid\n"
		<< "%type_void_func = OpTypeFunction %type_void\n"

		<< "%type_bool							= OpTypeBool\n"
		<< "%type_int							= OpTypeInt 32 1\n"
		<< "%type_uint							= OpTypeInt 32 0\n"
		<< "%type_float							= OpTypeFloat 32\n"
		<< "%type_vec2							= OpTypeVector %type_float 2\n"
		<< "%type_vec3							= OpTypeVector %type_float 3\n"
		<< "%type_vec4							= OpTypeVector %type_float 4\n"
		<< "%type_ivec4						= OpTypeVector %type_int  4\n"
		<< "%type_uvec4						= OpTypeVector %type_uint 4\n"
		<< "%type_uniformblock					= OpTypeStruct %type_uint %type_vec2\n"
		<< "%type_struct_int_img_comp_vec4	= OpTypeStruct %type_int " << typeImgCompVec4 << "\n"

		<< "%type_input_vec3					= OpTypePointer Input %type_vec3\n"
		<< "%type_input_float					= OpTypePointer Input %type_float\n"

		<< "%type_output_img_comp_vec4			= OpTypePointer Output " << typeImgCompVec4 << "\n"
		<< "%type_output_uint					= OpTypePointer Output %type_uint\n"

		<< "%type_function_int					= OpTypePointer Function %type_int\n"
		<< "%type_function_img_comp_vec4		= OpTypePointer Function " << typeImgCompVec4 << "\n"
		<< "%type_function_int_img_comp_vec4	= OpTypePointer Function %type_struct_int_img_comp_vec4\n"

		<< "%type_pushconstant_uniformblock				= OpTypePointer PushConstant %type_uniformblock\n"
		<< "%type_pushconstant_uniformblock_member_lod  = OpTypePointer PushConstant %type_uint\n"
		<< "%type_pushconstant_uniformblock_member_size = OpTypePointer PushConstant %type_vec2\n"

		<< "%type_image_sparse				= " << getOpTypeImageSparse(m_imageType, m_format, typeImgComp, true) << "\n"
		<< "%type_sampled_image_sparse		= OpTypeSampledImage %type_image_sparse\n"
		<< "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_sampled_image_sparse\n"

		<< "%varying_texCoord			= OpVariable %type_input_vec3 Input\n"

		<< "%output_texel				= OpVariable %type_output_img_comp_vec4 Output\n"
		<< "%output_residency			= OpVariable %type_output_uint Output\n"

		<< "%uniformconst_image_sparse	= OpVariable %type_uniformconst_image_sparse UniformConstant\n"

		<< "%uniformblock_instance  = OpVariable %type_pushconstant_uniformblock PushConstant\n"

		// Declare constants
		<< "%constant_uint_0				= OpConstant %type_uint 0\n"
		<< "%constant_uint_1				= OpConstant %type_uint 1\n"
		<< "%constant_uint_2				= OpConstant %type_uint 2\n"
		<< "%constant_uint_3				= OpConstant %type_uint 3\n"
		<< "%constant_int_0					= OpConstant %type_int  0\n"
		<< "%constant_int_1					= OpConstant %type_int  1\n"
		<< "%constant_int_2					= OpConstant %type_int  2\n"
		<< "%constant_int_3					= OpConstant %type_int  3\n"
		<< "%constant_float_0				= OpConstant %type_float 0.0\n"
		<< "%constant_float_half			= OpConstant %type_float 0.5\n"
		<< "%constant_texel_resident		= OpConstant %type_uint " << MEMORY_BLOCK_BOUND_VALUE << "\n"
		<< "%constant_texel_not_resident	= OpConstant %type_uint " << MEMORY_BLOCK_NOT_BOUND_VALUE << "\n"

		// Call main function
		<< "%func_main		 = OpFunction %type_void None %type_void_func\n"
		<< "%label_func_main = OpLabel\n"

		<< "%local_image_sparse = OpLoad %type_sampled_image_sparse %uniformconst_image_sparse\n"

		<< "%texCoord = OpLoad %type_vec3 %varying_texCoord\n"

		<< "%local_texCoord_x = OpCompositeExtract %type_float %texCoord 0\n"
		<< "%local_texCoord_y = OpCompositeExtract %type_float %texCoord 1\n"
		<< "%local_texCoord_z = OpCompositeExtract %type_float %texCoord 2\n"

		<< "%local_texCoord_xy	= OpCompositeConstruct %type_vec2 %local_texCoord_x %local_texCoord_y\n"
		<< "%local_texCoord_xyz = OpCompositeConstruct %type_vec3 %local_texCoord_x %local_texCoord_y %local_texCoord_z\n"

		<< "%access_uniformblock_member_uint_lod = OpAccessChain %type_pushconstant_uniformblock_member_lod %uniformblock_instance %constant_int_0\n"
		<< "%local_uniformblock_member_uint_lod  = OpLoad %type_uint %access_uniformblock_member_uint_lod\n"
		<< "%local_uniformblock_member_float_lod = OpConvertUToF %type_float %local_uniformblock_member_uint_lod\n"
		<< "%access_uniformblock_member_size	 = OpAccessChain %type_pushconstant_uniformblock_member_size %uniformblock_instance %constant_int_1\n"
		<< "%local_uniformblock_member_size		 = OpLoad %type_vec2 %access_uniformblock_member_size\n"

		<< sparseImageOpString("%local_sparse_op_result", "%type_struct_int_img_comp_vec4", "%local_image_sparse", coordString, "%local_uniformblock_member_float_lod") << "\n"

		// Load texel value
		<< "%local_img_comp_vec4 = OpCompositeExtract " << typeImgCompVec4 << " %local_sparse_op_result 1\n"

		<< "OpStore %output_texel %local_img_comp_vec4\n"

		// Load residency code
		<< "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n"

		// Check if loaded texel is placed in resident memory
		<< "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
		<< "OpSelectionMerge %branch_texel_resident None\n"
		<< "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
		<< "%label_texel_resident = OpLabel\n"

		// Loaded texel is in resident memory
		<< "OpStore %output_residency %constant_texel_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%label_texel_not_resident = OpLabel\n"

		// Loaded texel is not in resident memory
		<< "OpStore %output_residency %constant_texel_not_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%branch_texel_resident = OpLabel\n"

		<< "OpReturn\n"
		<< "OpFunctionEnd\n";

	programCollection.spirvAsmSources.add("fragment_shader") << fs.str();
}